

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rigid-body-kinematics.hxx
# Opt level: O0

Orientation * __thiscall
stateObservation::kine::Orientation::integrate(Orientation *this,Vector3 *dt_x_omega)

{
  bool bVar1;
  QuaternionBase<Eigen::Quaternion<double,_0>_> *pQVar2;
  MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *pMVar3;
  Matrix3 local_1d8;
  Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> local_190;
  Matrix<double,_3,_3,_0,_3,_3> local_180;
  Quaternion local_138;
  Quaternion<double,_0> local_118;
  Matrix3 local_f8;
  Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> local_b0;
  Matrix<double,_3,_3,_0,_3,_3> local_a0;
  Quaternion<double,_0> local_58;
  undefined1 local_38 [8];
  Quaternion q;
  Vector3 *dt_x_omega_local;
  Orientation *this_local;
  
  q.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[3]
       = (double)dt_x_omega;
  check_(this);
  bVar1 = CheckedItem<Eigen::Quaternion<double,_0>,_false,_false,_true,_true>::isSet(&this->q_);
  if (bVar1) {
    bVar1 = isMatrixSet(this);
    if (bVar1) {
      rotationVectorToQuaternion((Quaternion *)local_38,dt_x_omega);
      pQVar2 = (QuaternionBase<Eigen::Quaternion<double,_0>_> *)
               CheckedItem<Eigen::Quaternion<double,_0>,_false,_false,_true,_true>::operator()
                         (&this->q_);
      Eigen::QuaternionBase<Eigen::Quaternion<double,0>>::operator*
                (&local_58,(QuaternionBase<Eigen::Quaternion<double,0>> *)local_38,pQVar2);
      CheckedItem<Eigen::Quaternion<double,_0>,_false,_false,_true,_true>::operator=
                (&this->q_,&local_58);
      Eigen::QuaternionBase<Eigen::Quaternion<double,_0>_>::toRotationMatrix
                (&local_f8,(QuaternionBase<Eigen::Quaternion<double,_0>_> *)local_38);
      pMVar3 = (MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
               CheckedItem<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_false,_false,_true,_true>::
               operator()(&this->m_);
      local_b0 = Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                           ((MatrixBase<Eigen::Matrix<double,3,3,0,3,3>> *)&local_f8,pMVar3);
      Eigen::Matrix<double,3,3,0,3,3>::
      Matrix<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>,0>>
                ((Matrix<double,3,3,0,3,3> *)&local_a0,
                 (EigenBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
                  *)&local_b0);
      CheckedItem<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_false,_false,_true,_true>::operator=
                (&this->m_,&local_a0);
    }
    else {
      rotationVectorToQuaternion(&local_138,dt_x_omega);
      pQVar2 = (QuaternionBase<Eigen::Quaternion<double,_0>_> *)
               CheckedItem<Eigen::Quaternion<double,_0>,_false,_false,_true,_true>::operator()
                         (&this->q_);
      Eigen::QuaternionBase<Eigen::Quaternion<double,0>>::operator*
                (&local_118,(QuaternionBase<Eigen::Quaternion<double,0>> *)&local_138,pQVar2);
      CheckedItem<Eigen::Quaternion<double,_0>,_false,_false,_true,_true>::operator=
                (&this->q_,&local_118);
    }
  }
  else {
    rotationVectorToRotationMatrix(&local_1d8,dt_x_omega);
    pMVar3 = (MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
             CheckedItem<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_false,_false,_true,_true>::operator()
                       (&this->m_);
    local_190 = Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                          ((MatrixBase<Eigen::Matrix<double,3,3,0,3,3>> *)&local_1d8,pMVar3);
    Eigen::Matrix<double,3,3,0,3,3>::
    Matrix<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>,0>>
              ((Matrix<double,3,3,0,3,3> *)&local_180,
               (EigenBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
                *)&local_190);
    CheckedItem<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_false,_false,_true,_true>::operator=
              (&this->m_,&local_180);
  }
  return this;
}

Assistant:

inline const Orientation & Orientation::integrate(Vector3 dt_x_omega)
{
  check_();
  if(q_.isSet())
  {
    if(isMatrixSet())
    {
      Quaternion q = kine::rotationVectorToQuaternion(dt_x_omega);
      q_ = q * q_();
      m_ = q.toRotationMatrix() * m_();
    }
    else
    {
      q_ = kine::rotationVectorToQuaternion(dt_x_omega) * q_();
    }
  }
  else
  {
    m_ = kine::rotationVectorToRotationMatrix(dt_x_omega) * m_();
  }
  return *this;
}